

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O0

void __thiscall converterApp_fileConversions_Test::TestBody(converterApp_fileConversions_Test *this)

{
  double val;
  bool bVar1;
  reference pvVar2;
  uint64_t uVar3;
  vector<convValue,_std::allocator<convValue>_> *this_00;
  Message *pMVar4;
  char *pcVar5;
  ulong uVar6;
  char *in_R9;
  double dVar7;
  precise_unit pVar8;
  AssertHelper local_220;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_3;
  double return_value;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  double res;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_128 [8];
  precise_unit unit_short;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_b0 [8];
  precise_unit unit;
  convValue *convcode;
  iterator __end1;
  iterator __begin1;
  vector<convValue,_std::allocator<convValue>_> *__range1;
  double baseValue;
  undefined1 local_58 [8];
  precise_unit baseUnit;
  allocator local_31;
  undefined1 local_30 [8];
  string testFile;
  converterApp_fileConversions_Test *this_local;
  
  testFile.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/test_conversions/"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  testing::
  WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::GetParam();
  std::__cxx11::string::append((string *)local_30);
  std::__cxx11::string::append(local_30);
  converterApp::loadFile(&this->super_converterApp,(string *)local_30);
  pvVar2 = std::vector<convValue,_std::allocator<convValue>_>::operator[]
                     (&(this->super_converterApp).unit_conv,0);
  std::__cxx11::string::string((string *)&baseValue,(string *)pvVar2);
  uVar3 = units::getDefaultFlags();
  pVar8 = units::unit_from_string((string *)&baseValue,uVar3);
  baseUnit.multiplier_ = pVar8._8_8_;
  local_58 = (undefined1  [8])pVar8.multiplier_;
  std::__cxx11::string::~string((string *)&baseValue);
  pvVar2 = std::vector<convValue,_std::allocator<convValue>_>::operator[]
                     (&(this->super_converterApp).unit_conv,0);
  val = pvVar2->value;
  this_00 = &(this->super_converterApp).unit_conv;
  __end1 = std::vector<convValue,_std::allocator<convValue>_>::begin(this_00);
  convcode = (convValue *)std::vector<convValue,_std::allocator<convValue>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<convValue_*,_std::vector<convValue,_std::allocator<convValue>_>_>
                                *)&convcode);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)local_30);
      return;
    }
    unit._8_8_ = __gnu_cxx::
                 __normal_iterator<convValue_*,_std::vector<convValue,_std::allocator<convValue>_>_>
                 ::operator*(&__end1);
    std::__cxx11::string::string((string *)&gtest_ar_.message_,(string *)unit._8_8_);
    uVar3 = units::getDefaultFlags();
    pVar8 = units::unit_from_string((string *)&gtest_ar_.message_,uVar3);
    unit.multiplier_ = pVar8._8_8_;
    local_b0 = (undefined1  [8])pVar8.multiplier_;
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    bVar1 = units::is_error((precise_unit *)local_b0);
    local_e1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_e0,&local_e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pMVar4 = testing::Message::operator<<(&local_f0,(char (*) [18])"error converting ");
      pMVar4 = testing::Message::operator<<
                         (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)unit._8_8_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&unit_short.base_units_,(internal *)local_e0,
                 (AssertionResult *)"is_error(unit)","true","false",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                 ,0x45,pcVar5);
      testing::internal::AssertHelper::operator=(&local_f8,pMVar4);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      std::__cxx11::string::~string((string *)&unit_short.base_units_);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::string((string *)&gtest_ar__1.message_,(string *)(unit._8_8_ + 0x20));
      uVar3 = units::getDefaultFlags();
      pVar8 = units::unit_from_string((string *)&gtest_ar__1.message_,uVar3);
      unit_short.multiplier_ = pVar8._8_8_;
      local_128 = (undefined1  [8])pVar8.multiplier_;
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      bVar1 = units::is_error((precise_unit *)local_128);
      local_159 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_158,&local_159,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar1) {
        testing::Message::Message(&local_168);
        pMVar4 = testing::Message::operator<<(&local_168,(char (*) [18])"error converting ");
        pMVar4 = testing::Message::operator<<
                           (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(unit._8_8_ + 0x20));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_158,
                   (AssertionResult *)"is_error(unit_short)","true","false",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                   ,0x48,pcVar5);
        testing::internal::AssertHelper::operator=(&local_170,pMVar4);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_168);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
      bVar1 = units::precise_unit::operator!=((precise_unit *)local_b0,(precise_unit *)local_128);
      if (!bVar1) {
        testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
                  ((EqHelper *)local_1c0,"unit","unit_short",(precise_unit *)local_b0,
                   (precise_unit *)local_128);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pMVar4 = testing::Message::operator<<
                             (&local_1c8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit._8_8_);
          pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [6])" and ");
          pMVar4 = testing::Message::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(unit._8_8_ + 0x20));
          pMVar4 = testing::Message::operator<<
                             (pMVar4,(char (*) [30])" do not produce the same unit");
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&res,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x52,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&res,pMVar4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&res);
          testing::Message::~Message(&local_1c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        goto LAB_00130357;
      }
      bVar1 = units::precise_unit::operator==
                        ((precise_unit *)local_b0,(precise_unit *)units::precise::log::bel);
      if (!bVar1) {
        dVar7 = units::convert<units::precise_unit,units::precise_unit>
                          (1.0,(precise_unit *)local_b0,(precise_unit *)local_128);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)local_1a0,"convert(1.0, unit, unit_short)","1.0F",(float)dVar7,1.0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
        if (!bVar1) {
          testing::Message::Message(&local_1a8);
          pMVar4 = testing::Message::operator<<
                             (&local_1a8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (unit._8_8_ + 0x20));
          pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [6])" and ");
          pMVar4 = testing::Message::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)unit._8_8_);
          pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [14])" do not match");
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                     ,0x4e,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_1a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
        goto LAB_00130357;
      }
    }
    else {
LAB_00130357:
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )units::convert<units::precise_unit,units::precise_unit>
                       (val,(precise_unit *)local_58,(precise_unit *)local_b0);
      testing::internal::DoubleNearPredFormat
                ((internal *)local_1e8,"res / convcode.value","1.0","0.003",
                 (double)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl / *(double *)(unit._8_8_ + 0x40),1.0,0.003);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar1) {
        testing::Message::Message(&local_1f0);
        pvVar2 = std::vector<convValue,_std::allocator<convValue>_>::operator[]
                           (&(this->super_converterApp).unit_conv,0);
        pMVar4 = testing::Message::operator<<(&local_1f0,&pvVar2->name);
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [5])0x1d3547);
        pMVar4 = testing::Message::operator<<
                           (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit._8_8_);
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [11])" produced ");
        pMVar4 = testing::Message::operator<<(pMVar4,(double *)&gtest_ar_2.message_);
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [7])" when ");
        pMVar4 = testing::Message::operator<<(pMVar4,(double *)(unit._8_8_ + 0x40));
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [10])" expected");
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&return_value,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                   ,0x58,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&return_value,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&return_value);
        testing::Message::~Message(&local_1f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
      gtest_ar_3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )units::convert<units::precise_unit,units::precise_unit>
                       (*(double *)(unit._8_8_ + 0x40),(precise_unit *)local_b0,
                        (precise_unit *)local_58);
      testing::internal::DoubleNearPredFormat
                ((internal *)local_210,"return_value / baseValue","1.0","0.003",
                 (double)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl / val,1.0,0.003);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
        testing::internal::AssertHelper::AssertHelper
                  (&local_220,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
                   ,0x5c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_220,&local_218);
        testing::internal::AssertHelper::~AssertHelper(&local_220);
        testing::Message::~Message(&local_218);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    }
    __gnu_cxx::__normal_iterator<convValue_*,_std::vector<convValue,_std::allocator<convValue>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

TEST_P(converterApp, fileConversions)
{
    std::string testFile = TEST_FILE_FOLDER "/test_conversions/";
    testFile.append(GetParam());
    testFile.append("_conversions.txt");
    loadFile(testFile);
    auto baseUnit = units::unit_from_string(unit_conv[0].name);
    double baseValue = unit_conv[0].value;
    for (auto& convcode : unit_conv) {
        auto unit = units::unit_from_string(convcode.name);
        EXPECT_FALSE(is_error(unit)) << "error converting " << convcode.name;
        if (!convcode.short_name.empty()) {
            auto unit_short = units::unit_from_string(convcode.short_name);
            EXPECT_FALSE(is_error(unit_short))
                << "error converting " << convcode.short_name;
            if (unit != unit_short) {
                if (unit == units::precise::log::bel) {
                    continue;  // this is a known choice to match SI
                }
                EXPECT_FLOAT_EQ(convert(1.0, unit, unit_short), 1.0F)
                    << convcode.short_name << " and " << convcode.name
                    << " do not match";
            } else {
                EXPECT_EQ(unit, unit_short)
                    << convcode.name << " and " << convcode.short_name
                    << " do not produce the same unit";
            }
        }
        double res = units::convert(baseValue, baseUnit, unit);
        EXPECT_NEAR(res / convcode.value, 1.0, 0.003)
            << unit_conv[0].name << " to " << convcode.name << " produced "
            << res << " when " << convcode.value << " expected";
        double return_value = units::convert(convcode.value, unit, baseUnit);
        EXPECT_NEAR(return_value / baseValue, 1.0, 0.003);
    }
}